

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

int sasl_mechanisms_get_sasl_server_mechanisms
              (SASL_MECHANISMS_HANDLE sasl_mechanisms,AMQP_VALUE *sasl_server_mechanisms_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  int iVar3;
  AMQP_VALUE pAVar4;
  bool bVar5;
  uint32_t item_count;
  char *sasl_server_mechanisms_single_value;
  uint32_t local_34;
  char *local_30;
  
  if (sasl_mechanisms == (SASL_MECHANISMS_HANDLE)0x0) {
    iVar3 = 0x2852;
  }
  else {
    iVar1 = amqpvalue_get_composite_item_count(sasl_mechanisms->composite_value,&local_34);
    iVar3 = 0x285a;
    if (iVar1 == 0) {
      if (local_34 == 0) {
        iVar3 = 0x2860;
      }
      else {
        pAVar4 = amqpvalue_get_composite_item_in_place(sasl_mechanisms->composite_value,0);
        iVar3 = 0x2868;
        if ((pAVar4 != (AMQP_VALUE)0x0) &&
           (AVar2 = amqpvalue_get_type(pAVar4), AVar2 != AMQP_TYPE_NULL)) {
          AVar2 = amqpvalue_get_type(pAVar4);
          if (AVar2 == AMQP_TYPE_ARRAY) {
            local_30 = (char *)0x0;
            bVar5 = true;
          }
          else {
            iVar3 = amqpvalue_get_symbol(pAVar4,&local_30);
            bVar5 = iVar3 != 0;
          }
          AVar2 = amqpvalue_get_type(pAVar4);
          if (AVar2 == AMQP_TYPE_ARRAY) {
            iVar3 = amqpvalue_get_array(pAVar4,sasl_server_mechanisms_value);
            if ((bool)(iVar3 != 0 & bVar5)) {
              return 0x287b;
            }
          }
          else if (bVar5) {
            return 0x287b;
          }
          AVar2 = amqpvalue_get_type(pAVar4);
          iVar3 = 0;
          if (AVar2 != AMQP_TYPE_ARRAY) {
            pAVar4 = amqpvalue_create_array();
            *sasl_server_mechanisms_value = pAVar4;
            if (pAVar4 == (AMQP_VALUE)0x0) {
              iVar3 = 0x2884;
            }
            else {
              pAVar4 = amqpvalue_create_symbol(local_30);
              if (pAVar4 == (AMQP_VALUE)0x0) {
                iVar3 = 0x288b;
              }
              else {
                iVar1 = amqpvalue_add_array_item(*sasl_server_mechanisms_value,pAVar4);
                iVar3 = 0x2891;
                if (iVar1 == 0) {
                  iVar1 = amqpvalue_set_composite_item
                                    (sasl_mechanisms->composite_value,0,
                                     *sasl_server_mechanisms_value);
                  iVar3 = 0x2897;
                  if (iVar1 == 0) {
                    iVar3 = 0;
                  }
                }
                amqpvalue_destroy(pAVar4);
              }
              amqpvalue_destroy(*sasl_server_mechanisms_value);
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int sasl_mechanisms_get_sasl_server_mechanisms(SASL_MECHANISMS_HANDLE sasl_mechanisms, AMQP_VALUE* sasl_server_mechanisms_value)
{
    int result;

    if (sasl_mechanisms == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        SASL_MECHANISMS_INSTANCE* sasl_mechanisms_instance = (SASL_MECHANISMS_INSTANCE*)sasl_mechanisms;
        if (amqpvalue_get_composite_item_count(sasl_mechanisms_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(sasl_mechanisms_instance->composite_value, 0);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    const char* sasl_server_mechanisms_single_value;
                    int get_single_value_result;
                    if (amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY)
                    {
                        get_single_value_result = amqpvalue_get_symbol(item_value, &sasl_server_mechanisms_single_value);
                    }
                    else
                    {
                        (void)memset((void*)&sasl_server_mechanisms_single_value, 0, sizeof(sasl_server_mechanisms_single_value));
                        get_single_value_result = 1;
                    }

                    if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, sasl_server_mechanisms_value) != 0)) &&
                        (get_single_value_result != 0))
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        if (amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY)
                        {
                            *sasl_server_mechanisms_value = amqpvalue_create_array();
                            if (*sasl_server_mechanisms_value == NULL)
                            {
                                result = MU_FAILURE;
                            }
                            else
                            {
                                AMQP_VALUE single_amqp_value = amqpvalue_create_symbol(sasl_server_mechanisms_single_value);
                                if (single_amqp_value == NULL)
                                {
                                    result = MU_FAILURE;
                                }
                                else
                                {
                                    if (amqpvalue_add_array_item(*sasl_server_mechanisms_value, single_amqp_value) != 0)
                                    {
                                        result = MU_FAILURE;
                                    }
                                    else
                                    {
                                        if (amqpvalue_set_composite_item(sasl_mechanisms_instance->composite_value, 0, *sasl_server_mechanisms_value) != 0)
                                        {
                                            result = MU_FAILURE;
                                        }
                                        else
                                        {
                                            result = 0;
                                        }
                                    }

                                    amqpvalue_destroy(single_amqp_value);
                                }
                                amqpvalue_destroy(*sasl_server_mechanisms_value);
                            }
                        }
                        else
                        {
                            result = 0;
                        }
                    }
                }
            }
        }
    }

    return result;
}